

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,string *name,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  _Base_ptr allowedFeatureTypes_00;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  _Var1;
  int iVar2;
  int iVar3;
  FeatureDescription *pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  int local_54;
  undefined1 local_50 [4];
  int i;
  Result result;
  string *name_local;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features_local;
  
  result.m_message.super__Rb_tree_node_base._M_right = &name->super__Rb_tree_node_base;
  result.m_message._M_storage._M_storage = (uchar  [8])features;
  Result::Result((Result *)local_50);
  local_54 = 0;
  do {
    iVar3 = local_54;
    iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this);
    _Var1 = result.m_message._M_storage;
    if (iVar2 <= iVar3) {
      std::operator+(&local_a8,"Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     result.m_message._M_storage._M_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
                     &local_a8,"\' to the model is not present in the model description.");
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
LAB_0036da4a:
      local_88._M_storage._M_storage[0] = '\x01';
      local_88._M_storage._M_storage[1] = '\0';
      local_88._M_storage._M_storage[2] = '\0';
      local_88._M_storage._M_storage[3] = '\0';
      Result::~Result((Result *)local_50);
      return __return_storage_ptr__;
    }
    pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this,local_54
                       );
    Specification::FeatureDescription::name_abi_cxx11_(pFVar4);
    iVar3 = std::__cxx11::string::compare((string *)_Var1._M_storage);
    allowedFeatureTypes_00 = result.m_message.super__Rb_tree_node_base._M_right;
    if (iVar3 == 0) {
      pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
               operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this,
                          local_54);
      validateSchemaTypes(__return_storage_ptr__,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)allowedFeatureTypes_00,pFVar4);
      goto LAB_0036da4a;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

inline Result validateDescriptionsContainFeatureWithNameAndType(const Descriptions &features,
                                                                    const std::string &name,
                                                                    const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            if (name.compare(features[i].name()) != 0) {
                continue;
            }
            return validateSchemaTypes(allowedFeatureTypes, features[i]);
        }

        return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH, "Expected feature '" + name + "' to the model is not present in the model description.");
    }